

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O1

string * google::protobuf::compiler::objectivec::anon_unknown_0::SanitizeNameForObjC
                   (string *__return_storage_ptr__,string *prefix,string *input,string *extension,
                   string *out_suffix_added)

{
  char cVar1;
  pointer __s1;
  ulong size;
  pointer __s2;
  size_t size_00;
  int iVar2;
  const_iterator cVar3;
  string sanitized;
  key_type local_88;
  string *local_68;
  string *local_60;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_68 = out_suffix_added;
  local_60 = __return_storage_ptr__;
  local_58 = extension;
  if ((anonymous_namespace)::
      SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
      ::kReservedWords_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
                                 ::kReservedWords_abi_cxx11_);
    if (iVar2 != 0) {
      (anonymous_namespace)::MakeWordsMap_abi_cxx11_
                (&(anonymous_namespace)::
                  SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
                  ::kReservedWords_abi_cxx11_,
                 (_anonymous_namespace_ *)(anonymous_namespace)::kReservedWordList,(char **)0x95,
                 (size_t)extension);
      __cxa_atexit(std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,
                   &(anonymous_namespace)::
                    SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
                    ::kReservedWords_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
                           ::kReservedWords_abi_cxx11_);
    }
  }
  if ((anonymous_namespace)::
      SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
      ::kNSObjectMethods_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
                                 ::kNSObjectMethods_abi_cxx11_);
    if (iVar2 != 0) {
      (anonymous_namespace)::MakeWordsMap_abi_cxx11_
                (&(anonymous_namespace)::
                  SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
                  ::kNSObjectMethods_abi_cxx11_,(_anonymous_namespace_ *)kNSObjectMethodsList,
                 (char **)0xb9,(size_t)extension);
      __cxa_atexit(std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,
                   &(anonymous_namespace)::
                    SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
                    ::kNSObjectMethods_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::
                           SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
                           ::kNSObjectMethods_abi_cxx11_);
    }
  }
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  __s1 = (input->_M_dataplus)._M_p;
  size = input->_M_string_length;
  if ((long)size < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig(size,"string length exceeds max size");
  }
  __s2 = (prefix->_M_dataplus)._M_p;
  size_00 = prefix->_M_string_length;
  if ((long)size_00 < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig(size_00,"string length exceeds max size");
  }
  if (size < size_00) {
LAB_0026f412:
    std::operator+(&local_50,prefix,input);
LAB_0026f422:
    std::__cxx11::string::operator=((string *)&local_88,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  else {
    iVar2 = bcmp(__s1,__s2,size_00);
    if (iVar2 != 0) goto LAB_0026f412;
    if ((input->_M_string_length == prefix->_M_string_length) ||
       (0x19 < (byte)((input->_M_dataplus)._M_p[prefix->_M_string_length] + 0xbfU))) {
      std::operator+(&local_50,prefix,input);
      goto LAB_0026f422;
    }
    std::__cxx11::string::_M_assign((string *)&local_88);
  }
  if ((local_88._M_string_length < 3) || (*local_88._M_dataplus._M_p != '_')) {
LAB_0026f469:
    cVar3 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(&(anonymous_namespace)::
                    SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
                    ::kReservedWords_abi_cxx11_._M_h,&local_88);
    if (cVar3.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      cVar3 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::find(&(anonymous_namespace)::
                      SanitizeNameForObjC(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string*)
                      ::kNSObjectMethods_abi_cxx11_._M_h,&local_88);
      if (cVar3.
          super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        if (local_68 != (string *)0x0) {
          local_68->_M_string_length = 0;
          *(local_68->_M_dataplus)._M_p = '\0';
        }
        (local_60->_M_dataplus)._M_p = (pointer)&local_60->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p == &local_88.field_2) {
          (local_60->field_2)._M_allocated_capacity =
               CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                        local_88.field_2._M_local_buf[0]);
          *(undefined8 *)((long)&local_60->field_2 + 8) = local_88.field_2._8_8_;
        }
        else {
          (local_60->_M_dataplus)._M_p = local_88._M_dataplus._M_p;
          (local_60->field_2)._M_allocated_capacity =
               CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                        local_88.field_2._M_local_buf[0]);
        }
        local_60->_M_string_length = local_88._M_string_length;
        local_88._M_string_length = 0;
        local_88.field_2._M_local_buf[0] = '\0';
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        goto LAB_0026f4be;
      }
    }
  }
  else {
    cVar1 = local_88._M_dataplus._M_p[1];
    iVar2 = isupper((int)cVar1);
    if ((cVar1 != 0x5f) && (iVar2 == 0)) goto LAB_0026f469;
  }
  if (local_68 != (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)local_68);
  }
  std::operator+(local_60,&local_88,local_58);
LAB_0026f4be:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  return local_60;
}

Assistant:

std::string SanitizeNameForObjC(const std::string& prefix,
                           const std::string& input,
                           const std::string& extension,
                           std::string* out_suffix_added) {
  static const std::unordered_set<std::string> kReservedWords =
      MakeWordsMap(kReservedWordList, GOOGLE_ARRAYSIZE(kReservedWordList));
  static const std::unordered_set<std::string> kNSObjectMethods =
      MakeWordsMap(kNSObjectMethodsList, GOOGLE_ARRAYSIZE(kNSObjectMethodsList));
  std::string sanitized;
  // We add the prefix in the cases where the string is missing a prefix.
  // We define "missing a prefix" as where 'input':
  // a) Doesn't start with the prefix or
  // b) Isn't equivalent to the prefix or
  // c) Has the prefix, but the letter after the prefix is lowercase
  if (HasPrefixString(input, prefix)) {
    if (input.length() == prefix.length() || !ascii_isupper(input[prefix.length()])) {
      sanitized = prefix + input;
    } else {
      sanitized = input;
    }
  } else {
    sanitized = prefix + input;
  }
  if (IsReservedCIdentifier(sanitized) ||
      (kReservedWords.count(sanitized) > 0) ||
      (kNSObjectMethods.count(sanitized) > 0)) {
    if (out_suffix_added) *out_suffix_added = extension;
    return sanitized + extension;
  }
  if (out_suffix_added) out_suffix_added->clear();
  return sanitized;
}